

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O0

void nn_propagate_8to4(float *inputs,float *weights,float *bias,int num_inputs_to_process,
                      int tot_num_inputs,int num_outputs,float *output_nodes,int is_clip_required)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  int iVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  __m128 high_128;
  __m128 low_128;
  __m256 sum_par;
  __m256 mul1;
  __m256 mul0;
  __m256 weight1;
  __m256 weight0;
  int index;
  int i;
  int weight_idx;
  __m256 inputs256;
  int in;
  __m128 in_result;
  __m128 bias_reg;
  int out;
  __m256 hadd [2];
  int local_328;
  int local_2f4;
  undefined1 local_2f0 [8];
  undefined8 uStack_2e8;
  int local_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  ulong uStack_228;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  
  for (local_2c4 = 0; local_2c4 < in_R9D; local_2c4 = local_2c4 + 4) {
    puVar14 = (undefined8 *)(in_RDX + (long)local_2c4 * 4);
    uVar2 = *puVar14;
    uVar3 = puVar14[1];
    uStack_228 = SUB168(ZEXT816(0),4);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uStack_228;
    _local_2f0 = auVar12 << 0x40;
    for (local_2f4 = 0; local_1d0 = local_2f0._0_4_, fStack_1cc = local_2f0._4_4_,
        fStack_1c8 = local_2f0._8_4_, fStack_1c4 = local_2f0._12_4_, local_2f4 < in_ECX;
        local_2f4 = local_2f4 + 8) {
      puVar14 = (undefined8 *)(in_RDI + (long)local_2f4 * 4);
      uVar4 = *puVar14;
      uVar5 = puVar14[1];
      uVar6 = puVar14[2];
      uVar7 = puVar14[3];
      for (local_328 = 0; local_328 < 2; local_328 = local_328 + 1) {
        iVar13 = local_2f4 + local_2c4 * in_R8D + local_328 * 2 * in_R8D;
        puVar14 = (undefined8 *)(in_RSI + (long)iVar13 * 4);
        puVar15 = (undefined8 *)(in_RSI + (long)(iVar13 + in_R8D) * 4);
        local_100 = (float)uVar4;
        fStack_fc = (float)((ulong)uVar4 >> 0x20);
        fStack_f8 = (float)uVar5;
        fStack_f4 = (float)((ulong)uVar5 >> 0x20);
        fStack_f0 = (float)uVar6;
        fStack_ec = (float)((ulong)uVar6 >> 0x20);
        fStack_e8 = (float)uVar7;
        uStack_e4 = (undefined4)((ulong)uVar7 >> 0x20);
        local_120 = (float)*puVar14;
        fStack_11c = (float)((ulong)*puVar14 >> 0x20);
        fStack_118 = (float)puVar14[1];
        fStack_114 = (float)((ulong)puVar14[1] >> 0x20);
        fStack_110 = (float)puVar14[2];
        fStack_10c = (float)((ulong)puVar14[2] >> 0x20);
        fStack_108 = (float)puVar14[3];
        local_160 = (float)*puVar15;
        fStack_15c = (float)((ulong)*puVar15 >> 0x20);
        fStack_158 = (float)puVar15[1];
        fStack_154 = (float)((ulong)puVar15[1] >> 0x20);
        fStack_150 = (float)puVar15[2];
        fStack_14c = (float)((ulong)puVar15[2] >> 0x20);
        fStack_148 = (float)puVar15[3];
        auVar11._4_4_ = fStack_fc * fStack_11c;
        auVar11._0_4_ = local_100 * local_120;
        auVar11._12_4_ = fStack_f4 * fStack_114;
        auVar11._8_4_ = fStack_f8 * fStack_118;
        auVar11._20_4_ = fStack_ec * fStack_10c;
        auVar11._16_4_ = fStack_f0 * fStack_110;
        auVar11._28_4_ = uStack_e4;
        auVar11._24_4_ = fStack_e8 * fStack_108;
        auVar10._4_4_ = fStack_fc * fStack_15c;
        auVar10._0_4_ = local_100 * local_160;
        auVar10._12_4_ = fStack_f4 * fStack_154;
        auVar10._8_4_ = fStack_f8 * fStack_158;
        auVar10._20_4_ = fStack_ec * fStack_14c;
        auVar10._16_4_ = fStack_f0 * fStack_150;
        auVar10._28_4_ = uStack_e4;
        auVar10._24_4_ = fStack_e8 * fStack_148;
        auVar1 = vhaddps_avx(auVar11,auVar10);
        *(undefined1 (*) [32])(&local_2c0 + (long)local_328 * 4) = auVar1;
      }
      auVar9._8_8_ = uStack_2b8;
      auVar9._0_8_ = local_2c0;
      auVar9._16_8_ = uStack_2b0;
      auVar9._24_8_ = uStack_2a8;
      auVar1._8_8_ = uStack_298;
      auVar1._0_8_ = local_2a0;
      auVar1._16_8_ = uStack_290;
      auVar1._24_8_ = uStack_288;
      auVar1 = vhaddps_avx(auVar9,auVar1);
      local_190 = auVar1._0_4_;
      fStack_18c = auVar1._4_4_;
      fStack_188 = auVar1._8_4_;
      fStack_184 = auVar1._12_4_;
      local_1a0 = auVar1._16_4_;
      fStack_19c = auVar1._20_4_;
      fStack_198 = auVar1._24_4_;
      fStack_194 = auVar1._28_4_;
      local_2f0._4_4_ = fStack_1cc + fStack_18c + fStack_19c;
      local_2f0._0_4_ = local_1d0 + local_190 + local_1a0;
      uStack_2e8._0_4_ = fStack_1c8 + fStack_188 + fStack_198;
      uStack_2e8._4_4_ = fStack_1c4 + fStack_184 + fStack_194;
    }
    local_1e0 = (float)uVar2;
    fStack_1dc = (float)((ulong)uVar2 >> 0x20);
    fStack_1d8 = (float)uVar3;
    fStack_1d4 = (float)((ulong)uVar3 >> 0x20);
    local_2f0._4_4_ = fStack_1cc + fStack_1dc;
    local_2f0._0_4_ = local_1d0 + local_1e0;
    uStack_2e8._0_4_ = fStack_1c8 + fStack_1d8;
    uStack_2e8._4_4_ = fStack_1c4 + fStack_1d4;
    if ((int)output_nodes != 0) {
      auVar8._8_8_ = uStack_2e8;
      auVar8._0_8_ = local_2f0;
      _local_2f0 = vmaxps_avx(auVar8,ZEXT816(0));
    }
    puVar14 = (undefined8 *)(in_stack_00000008 + (long)local_2c4 * 4);
    *puVar14 = local_2f0;
    puVar14[1] = uStack_2e8;
  }
  return;
}

Assistant:

static void nn_propagate_8to4(const float *const inputs,
                              const float *const weights, __m128 *const outputs,
                              const int num_inputs) {
  const __m128 inputs_h = _mm_loadu_ps(inputs + 4);
  const __m128 inputs_l = _mm_loadu_ps(inputs);
  // [7 6 5 4] [3 2 1 0] (input indices)

  __m128 add[4];
  for (int i = 0; i < 4; i++) {  // For each output:
    const __m128 weight_h = _mm_loadu_ps(&weights[i * num_inputs + 4]);
    const __m128 weight_l = _mm_loadu_ps(&weights[i * num_inputs]);
    const __m128 mul_h = _mm_mul_ps(inputs_h, weight_h);
    const __m128 mul_l = _mm_mul_ps(inputs_l, weight_l);
    add[i] = _mm_add_ps(mul_l, mul_h);
  }
  // add[0] = [7+3 6+2 5+1 4+0]
  // add[1] = [15+11 14+10 13+9 12+8]
  // add[2] = [23+19 22+18 21+17 20+16]
  // add[3] = [31+27 30+26 29+25 28+24]

  const __m128 hadd_h = _mm_hadd_ps(add[2], add[3]);
  // [31+30+27+26 29+28+25+24 23+22+19+18 21+20+17+16]
  const __m128 hadd_l = _mm_hadd_ps(add[0], add[1]);
  // [15+14+11+10 13+12+9+8 7+6+3+2 5+4+1+0]

  const __m128 haddhadd = _mm_hadd_ps(hadd_l, hadd_h);
  // [31+30+29+28+27+26+25+24 23+22+21+20+19+18+17+16
  //  15+14+13+12+11+10+9+8 7+6+5+4+3+2+1+0]

  *outputs = _mm_add_ps(*outputs, haddhadd);
}